

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::UnionInPlace
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  uint *puVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  long lVar8;
  CharSetInner *this_00;
  undefined4 extraout_var;
  uint i;
  uint index;
  undefined8 *puVar9;
  
  if ((other->rep).compact.countPlusOne - 1 < 5) {
    index = 0;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (4 < (other->rep).compact.countPlusOne - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar4) goto LAB_00e6fd88;
        *puVar7 = 0;
      }
      if (*(int *)&other->rep - 1U <= index) break;
      uVar5 = GetCompactCharU(other,index);
      SetRange(this,allocator,(Char)uVar5,(Char)uVar5);
      index = index + 1;
    }
  }
  else {
    if ((this->rep).compact.countPlusOne - 1 < 5) {
      SwitchRepresentations(this,allocator);
    }
    if (((this->rep).compact.countPlusOne - 1 < 5) || ((other->rep).compact.countPlusOne - 1 < 5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x48e,"(!IsCompact() && !other.IsCompact())",
                         "!IsCompact() && !other.IsCompact()");
      if (!bVar4) {
LAB_00e6fd88:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    lVar8 = 2;
    do {
      puVar1 = (uint *)((long)&this->rep + lVar8 * 4);
      *puVar1 = *puVar1 | *(uint *)((long)&other->rep + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 10);
    puVar9 = (undefined8 *)(other->rep).compact.countPlusOne;
    if (puVar9 != (undefined8 *)0x0) {
      pCVar2 = (this->rep).full.root;
      if (puVar9 == &CharSetFull::Instance) {
        puVar9 = &CharSetFull::Instance;
        if (pCVar2 != (CharSetNode *)0x0) {
          (**pCVar2->_vptr_CharSetNode)(pCVar2,allocator);
        }
      }
      else {
        if (pCVar2 == (CharSetNode *)0x0) {
          this_00 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x366bee);
          CharSetInner::CharSetInner(this_00);
          (this->rep).full.root = (CharSetNode *)this_00;
        }
        pCVar2 = (this->rep).full.root;
        iVar6 = (*pCVar2->_vptr_CharSetNode[4])
                          (pCVar2,allocator,2,(other->rep).compact.countPlusOne);
        puVar9 = (undefined8 *)CONCAT44(extraout_var,iVar6);
      }
      (this->rep).compact.countPlusOne = (size_t)puVar9;
    }
  }
  return;
}

Assistant:

void CharSet<char16>::UnionInPlace(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                Set(allocator, other.GetCompactChar(i));
            }
            return;
        }

        if (IsCompact())
            SwitchRepresentations(allocator);

        Assert(!IsCompact() && !other.IsCompact());

        rep.full.direct.UnionInPlace(other.rep.full.direct);

        if (other.rep.full.root != nullptr)
        {
            if (other.rep.full.root == CharSetFull::TheFullNode)
            {
                if (rep.full.root != nullptr)
                    rep.full.root->FreeSelf(allocator);
                rep.full.root = CharSetFull::TheFullNode;
            }
            else
            {
                if (rep.full.root == nullptr)
                    rep.full.root = Anew(allocator, CharSetInner);
                rep.full.root = rep.full.root->UnionInPlace(allocator, CharSetNode::levels - 1, other.rep.full.root);
            }
        }
    }